

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O3

FunctionSignaturePart * __thiscall
Jinx::Impl::FunctionSignaturePart::operator=
          (FunctionSignaturePart *this,FunctionSignaturePart *copy)

{
  if (this != copy) {
    this->partType = copy->partType;
    this->optional = copy->optional;
    this->valueType = copy->valueType;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ::operator=(&this->names,&copy->names);
  }
  return this;
}

Assistant:

inline_t FunctionSignaturePart & FunctionSignaturePart::operator = (const FunctionSignaturePart & copy)
	{
		if (this != &copy)
		{
			partType = copy.partType;
			optional = copy.optional;
			valueType = copy.valueType;
			names = copy.names;
		}
		return *this;
	}